

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::SimpleTypeHandler<1UL>::ConvertToTypeWithItemAttributes
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  bool bVar1;
  undefined8 local_28;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  bVar1 = Js::JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    local_28 = ConvertToES5ArrayType(this,instance);
  }
  else {
    local_28 = (ES5ArrayTypeHandler *)ConvertToDictionaryType(this,instance);
  }
  return (DynamicTypeHandler *)local_28;
}

Assistant:

DynamicTypeHandler* SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }